

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

bool __thiscall Js::FunctionBody::DoStackScopeSlots(FunctionBody *this)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  
  if ((((this->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) ||
     (pNVar1 = (this->super_ParseableFunctionInfo).nestedArray.ptr, pNVar1 == (NestedArray *)0x0)) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    if (((pNVar1->nestedCount != 0) &&
        (bVar3 = false, (this->super_ParseableFunctionInfo).scopeSlotArraySize != 0)) &&
       (bVar3 = false, this->m_envDepth != 0xffff)) {
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
      if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,StackClosurePhase,sourceContextId,
                                ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
      bVar3 = !bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool DoStackScopeSlots() const { return DoStackClosure(this) && !PHASE_OFF(StackClosurePhase, this); }